

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O0

int async(thread_pool_t *pool,future_t *future,callable_t callable)

{
  int iVar1;
  wrap_t *wrapper_00;
  runnable_t *__ptr;
  runnable_t *my_runnable;
  wrap_t *wrapper;
  future_t *future_local;
  thread_pool_t *pool_local;
  
  iVar1 = future_init(future);
  if (iVar1 == -1) {
    fprintf(_stderr,"async(): future_init() failed as future is NULL.\n");
    pool_local._4_4_ = -1;
  }
  else {
    wrapper_00 = (wrap_t *)malloc(0x28);
    if (wrapper_00 == (wrap_t *)0x0) {
      fprintf(_stderr,"async(): malloc failed for creating wrapper.\n");
      pool_local._4_4_ = -1;
    }
    else {
      (wrapper_00->callable).function = callable.function;
      (wrapper_00->callable).arg = callable.arg;
      (wrapper_00->callable).argsz = callable.argsz;
      wrapper_00->future = future;
      wrapper_00->runnable = (runnable_t *)0x0;
      __ptr = callable_to_runnable(wrapper_00);
      if (__ptr == (runnable_t *)0x0) {
        fprintf(_stderr,"async(): malloc failed for creating new runnable.\n");
        pool_local._4_4_ = -1;
      }
      else {
        wrapper_00->runnable = __ptr;
        iVar1 = defer(pool,*__ptr);
        if (iVar1 == 0) {
          pool_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"async(): Submitting new callable task failed.\n");
          free(wrapper_00);
          free(__ptr);
          pool_local._4_4_ = -1;
        }
      }
    }
  }
  return pool_local._4_4_;
}

Assistant:

int async(thread_pool_t *pool, future_t *future, callable_t callable) {
    if (future_init(future) == -1) {
        err("async(): future_init() failed as future is NULL.\n");
        return -1;
    }

    wrap_t *wrapper = malloc(sizeof(wrap_t));

    if (wrapper == NULL) {
        err("async(): malloc failed for creating wrapper.\n");
        return -1;
    }

    wrapper->callable = callable;
    wrapper->future = future;
    wrapper->runnable = NULL;

    runnable_t *my_runnable = callable_to_runnable(wrapper);

    if (my_runnable == NULL) {
        err("async(): malloc failed for creating new runnable.\n");
        return -1;
    }

    wrapper->runnable = my_runnable;

    if (defer(pool, *my_runnable) != 0) {
        err("async(): Submitting new callable task failed.\n");
        free(wrapper);
        free(my_runnable);
        return -1;
    }

    return 0;
}